

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ProxyClient::FetchMeshLocalPrefix(ProxyClient *this,ErrorHandler *aHandler)

{
  CommissionerImpl *pCVar1;
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  local_60;
  undefined1 local_40 [8];
  anon_class_40_2_1bbb15e4 onResponse;
  ErrorHandler *aHandler_local;
  ProxyClient *this_local;
  
  local_40 = (undefined1  [8])this;
  onResponse.aHandler._M_invoker = (_Invoker_type)aHandler;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&onResponse,aHandler);
  pCVar1 = this->mCommissioner;
  std::function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>::
  function<ot::commissioner::ProxyClient::FetchMeshLocalPrefix(std::function<void(ot::commissioner::Error)>)::__0&,void>
            ((function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>
              *)&local_60,(anon_class_40_2_1bbb15e4 *)local_40);
  (*(pCVar1->super_Commissioner)._vptr_Commissioner[0x19])(pCVar1,&local_60,0x800);
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::~function(&local_60);
  FetchMeshLocalPrefix(std::function<void(ot::commissioner::Error)>)::$_0::~__0((__0 *)local_40);
  return;
}

Assistant:

void ProxyClient::FetchMeshLocalPrefix(Commissioner::ErrorHandler aHandler)
{
    auto onResponse = [=](const ActiveOperationalDataset *aActiveDataset, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        ASSERT(aActiveDataset != nullptr);

        VerifyOrExit(aActiveDataset->mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit,
                     error = ERROR_BAD_FORMAT("Mesh-Local prefix not included in response"));
        SuccessOrExit(error = SetMeshLocalPrefix(aActiveDataset->mMeshLocalPrefix));

    exit:
        aHandler(aError);
    };

    mCommissioner.GetActiveDataset(onResponse, ActiveOperationalDataset::kMeshLocalPrefixBit);
}